

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

void fy_emit_token_write_folded(fy_emitter *emit,fy_token *fyt,int flags,int indent)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  uint local_22c;
  undefined1 local_228 [8];
  fy_atom_iter iter;
  fy_atom *atom;
  uint local_30;
  int iStack_2c;
  char chomp;
  int nrbreakslim;
  int nrbreaks;
  int c;
  _Bool breaks;
  uint uStack_1c;
  _Bool leading_spaces;
  int indent_local;
  int flags_local;
  fy_token *fyt_local;
  fy_emitter *emit_local;
  
  c = indent;
  uStack_1c = flags;
  _indent_local = fyt;
  fyt_local = (fy_token *)emit;
  fy_emit_write_indicator(emit,di_greater,flags,indent,fyewt_indicator);
  fy_emit_token_write_block_hints
            ((fy_emitter *)fyt_local,_indent_local,uStack_1c,c,(char *)((long)&atom + 7));
  if ((uStack_1c & 1) != 0) {
    iVar2 = fy_emit_indent((fy_emitter *)fyt_local);
    c = iVar2 + c;
  }
  fy_emit_putc((fy_emitter *)fyt_local,fyewt_linebreak,10);
  *(uint *)((long)&(fyt_local->node).prev + 4) = *(uint *)((long)&(fyt_local->node).prev + 4) | 3;
  iter._480_8_ = fy_token_atom(_indent_local);
  if ((fy_atom *)iter._480_8_ != (fy_atom *)0x0) {
    nrbreaks._2_1_ = 1;
    nrbreaks._3_1_ = 1;
    fy_atom_iter_start((fy_atom *)iter._480_8_,(fy_atom_iter *)local_228);
    fy_emit_accum_start((fy_emit_accum *)&fyt_local->text0,fyewt_folded_scalar);
    while (nrbreakslim = fy_atom_iter_utf8_get((fy_atom_iter *)local_228), 0 < nrbreakslim) {
      _Var1 = fy_is_lb(nrbreakslim);
      if (_Var1) {
        iVar2 = fy_emit_accum_utf8_size((fy_emit_accum *)&fyt_local->text0);
        if (iVar2 != 0) {
          fy_emit_accum_output((fy_emit_accum *)&fyt_local->text0);
          iVar2 = fy_atom_iter_utf8_peek((fy_atom_iter *)local_228);
          _Var1 = fy_is_z(iVar2);
          if ((!_Var1) && ((nrbreaks._3_1_ & 1) == 0)) {
            fy_emit_write_indent((fy_emitter *)fyt_local,c);
          }
        }
        iStack_2c = 1;
        while( true ) {
          nrbreakslim = fy_atom_iter_utf8_peek((fy_atom_iter *)local_228);
          _Var1 = fy_is_lb(nrbreakslim);
          if (!_Var1) break;
          iStack_2c = iStack_2c + 1;
          fy_atom_iter_utf8_get((fy_atom_iter *)local_228);
        }
        _Var1 = fy_is_z(nrbreakslim);
        if (_Var1) {
          local_22c = 2;
        }
        else {
          _Var1 = fy_is_blank(nrbreakslim);
          local_22c = (uint)_Var1;
        }
        local_30 = local_22c;
        while ((int)local_30 < iStack_2c) {
          *(uint *)((long)&(fyt_local->node).prev + 4) =
               *(uint *)((long)&(fyt_local->node).prev + 4) & 0xfffffffd;
          iStack_2c = iStack_2c + -1;
          fy_emit_write_indent((fy_emitter *)fyt_local,c);
        }
        nrbreaks._2_1_ = 1;
        iStack_2c = iStack_2c + -1;
      }
      else {
        if ((nrbreaks._2_1_ & 1) != 0) {
          fy_emit_write_indent((fy_emitter *)fyt_local,c);
          nrbreaks._3_1_ = fy_is_ws(nrbreakslim);
        }
        if (((nrbreaks._2_1_ & 1) == 0) && (_Var1 = fy_is_space(nrbreakslim), _Var1)) {
          iVar2 = fy_atom_iter_utf8_peek((fy_atom_iter *)local_228);
          _Var1 = fy_is_space(iVar2);
          if (_Var1) goto LAB_00137ab3;
          iVar2 = fy_emit_accum_column((fy_emit_accum *)&fyt_local->text0);
          iVar3 = fy_emit_width((fy_emitter *)fyt_local);
          if (iVar2 <= iVar3) goto LAB_00137ab3;
          fy_emit_accum_output((fy_emit_accum *)&fyt_local->text0);
          *(uint *)((long)&(fyt_local->node).prev + 4) =
               *(uint *)((long)&(fyt_local->node).prev + 4) & 0xfffffffd;
          fy_emit_write_indent((fy_emitter *)fyt_local,c);
        }
        else {
LAB_00137ab3:
          fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,nrbreakslim);
        }
        nrbreaks._2_1_ = 0;
      }
    }
    fy_emit_accum_output((fy_emit_accum *)&fyt_local->text0);
    fy_emit_accum_finish((fy_emit_accum *)&fyt_local->text0);
    fy_atom_iter_finish((fy_atom_iter *)local_228);
  }
  return;
}

Assistant:

void fy_emit_token_write_folded(struct fy_emitter *emit, struct fy_token *fyt, int flags, int indent) {
    bool leading_spaces, breaks;
    int c, nrbreaks, nrbreakslim;
    char chomp;
    struct fy_atom *atom;
    struct fy_atom_iter iter;

    fy_emit_write_indicator(emit, di_greater, flags, indent, fyewt_indicator);

    fy_emit_token_write_block_hints(emit, fyt, flags, indent, &chomp);
    if (flags & DDNF_ROOT)
        indent += fy_emit_indent(emit);

    fy_emit_putc(emit, fyewt_linebreak, '\n');
    emit->flags |= FYEF_WHITESPACE | FYEF_INDENTATION;

    atom = fy_token_atom(fyt);
    if (!atom)
        return;

    breaks = true;
    leading_spaces = true;

    fy_atom_iter_start(atom, &iter);
    fy_emit_accum_start(&emit->ea, fyewt_folded_scalar);
    while ((c = fy_atom_iter_utf8_get(&iter)) > 0) {

        if (fy_is_lb(c)) {

            /* output run */
            if (fy_emit_accum_utf8_size(&emit->ea)) {
                fy_emit_accum_output(&emit->ea);
                /* do not output a newline (indent) if at the end or
                 * this is a leading spaces line */
                if (!fy_is_z(fy_atom_iter_utf8_peek(&iter)) && !leading_spaces)
                    fy_emit_write_indent(emit, indent);
            }

            /* count the number of consecutive breaks */
            nrbreaks = 1;
            while (fy_is_lb(c = fy_atom_iter_utf8_peek(&iter))) {
                nrbreaks++;
                (void) fy_atom_iter_utf8_get(&iter);
            }

            /* NOTE: Because the number of indents is tricky
             * if it's a non blank, non end, it's the number of breaks
             * if it's a blank, it's the number of breaks minus 1
             * if it's the end, it's the number of breaks minus 2
             */
            nrbreakslim = fy_is_z(c) ? 2 : fy_is_blank(c) ? 1 : 0;
            while (nrbreaks-- > nrbreakslim) {
                emit->flags &= ~FYEF_INDENTATION;
                fy_emit_write_indent(emit, indent);
            }

            breaks = true;

        } else {

            /* if we had a break, output an indent */
            if (breaks) {
                fy_emit_write_indent(emit, indent);

                /* if this line starts with whitespace we need to know */
                leading_spaces = fy_is_ws(c);
            }

            if (!breaks && fy_is_space(c) &&
                !fy_is_space(fy_atom_iter_utf8_peek(&iter)) &&
                fy_emit_accum_column(&emit->ea) > fy_emit_width(emit)) {
                fy_emit_accum_output(&emit->ea);
                emit->flags &= ~FYEF_INDENTATION;
                fy_emit_write_indent(emit, indent);
            } else
                fy_emit_accum_utf8_put(&emit->ea, c);

            breaks = false;
        }
    }
    fy_emit_accum_output(&emit->ea);
    fy_emit_accum_finish(&emit->ea);
    fy_atom_iter_finish(&iter);
}